

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testBitIdx(void)

{
  size_t z_1;
  size_t y_1;
  size_t x_1;
  size_t size_1;
  size_t i;
  size_t z;
  size_t y;
  size_t x;
  size_t size;
  undefined8 local_28;
  
  axl::sl::getAllocSize(0x1171cd);
  axl::sl::getPowerOf2Ge64(0);
  axl::sl::getHiBit64(0);
  axl::sl::getLoBit64(0);
  for (local_28 = 1; local_28 < 0x8000000; local_28 = local_28 + 1) {
    axl::sl::getAllocSize(0x11721a);
    axl::sl::getPowerOf2Ge64(local_28);
    axl::sl::getHiBit64(local_28);
    axl::sl::getLoBit64(local_28);
  }
  return;
}

Assistant:

void
testBitIdx() {
	size_t size = sl::getAllocSize(0);
	ASSERT(size == 0);

	size_t x = sl::getPowerOf2Ge(0);
	ASSERT(x == 0);

	size_t y = sl::getHiBit(0);
	ASSERT(y == 0);

	size_t z = sl::getLoBit(0);
	ASSERT(z == 0);

	for (size_t i = 1; i < 128 * 1024 * 1024; i++) {
		size_t size = sl::getAllocSize(i);
		ASSERT(size >= i);

		size_t x = sl::getPowerOf2Ge(i);
		ASSERT(x >= i);

		size_t y = sl::getHiBit(i);
		ASSERT((i & y) && y <= i);

		size_t z = sl::getLoBit(i);
		ASSERT((i & z) && z <= y);
	}
}